

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O0

void __thiscall crail::Filename::Filename(Filename *this,string *name)

{
  int *start;
  int *piVar1;
  ulong in_RSI;
  string *in_RDI;
  int hash_code;
  int name_stop;
  int name_start;
  int index_comp;
  int index_name;
  string local_40 [28];
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  ulong local_10;
  
  local_10 = in_RSI;
  Serializable::Serializable((Serializable *)in_RDI);
  *(undefined ***)in_RDI = &PTR_Write_00190928;
  std::string::string(in_RDI + 0x50);
  local_14 = 1;
  local_18 = 0;
  local_1c = 1;
  local_20 = 1;
  while( true ) {
    start = (int *)(long)local_14;
    piVar1 = (int *)std::string::length();
    if (piVar1 <= start) break;
    local_1c = local_14;
    local_24 = file_hash(in_RDI,start);
    local_20 = local_14 + -1;
    *(int *)(in_RDI + (long)local_18 * 4 + 0xc) = local_24;
    local_18 = local_18 + 1;
    local_14 = local_14 + 1;
  }
  *(int *)(in_RDI + 8) = local_18;
  std::string::substr((ulong)local_40,local_10);
  std::string::operator=(in_RDI + 0x50,local_40);
  std::string::~string(local_40);
  return;
}

Assistant:

Filename::Filename(string &name) {
  int index_name = 1;
  int index_comp = 0;
  int name_start = index_name;
  int name_stop = name_start;
  while (index_name < name.length()) {
    name_start = index_name;
    int hash_code = file_hash(name, index_name);
    name_stop = index_name - 1;
    components_[index_comp] = hash_code;
    index_comp++;
    index_name++;
  }
  this->length_ = index_comp;
  this->name_ = name.substr(name_start, name_stop - name_start + 1);

  /*
char slash = '/';
int start_index = 1;
std::string::size_type pos = name.find(&slash, start_index);
int index = 0;
while (pos != std::string::npos) {
int hash_code = 0;
for (uint32_t i = start_index; i < pos; i++) {
hash_code = 31 * hash_code + name[i];
}
components_[index] = hash_code;
index++;
start_index = pos + 1;
}
if (start_index < name.length()) {
int hash_code = 0;
for (uint32_t i = start_index; i < name.length(); i++) {
hash_code = 31 * hash_code + name[i];
}
components_[index] = hash_code;
index++;
}
length_ = index;
while (index < kDirectoryDepth) {
components_[index] = 0;
index++;
}
  */

  /*
std::string token;
std::stringstream tokenStream(name);
int index = 0;
while (std::getline(tokenStream, token, '/')) {
if (token.empty()) {
continue;
}
components_[index] = file_hash(token);
name_ = token;
index++;
}
length_ = index;
while (index < kDirectoryDepth) {
components_[index] = 0;
index++;
}
  */
}